

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall clipp::detail::match_t::match_t(match_t *this,match_t *param_1)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  (this->str_)._M_dataplus._M_p = (pointer)&(this->str_).field_2;
  pcVar1 = (param_1->str_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->str_)._M_string_length);
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::vector((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            *)&this->pos_,
           (vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            *)&param_1->pos_);
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::vector(&(this->pos_).lastMatch_.stack_,&(param_1->pos_).lastMatch_.stack_);
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::vector(&(this->pos_).posAfterLastMatch_.stack_,&(param_1->pos_).posAfterLastMatch_.stack_);
  std::
  deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ::deque(&(this->pos_).scopes_.c,&(param_1->pos_).scopes_.c);
  bVar2 = (param_1->pos_).ignoreBlocks_;
  bVar3 = (param_1->pos_).repeatGroupStarted_;
  bVar4 = (param_1->pos_).repeatGroupContinues_;
  (this->pos_).curMatched_ = (param_1->pos_).curMatched_;
  (this->pos_).ignoreBlocks_ = bVar2;
  (this->pos_).repeatGroupStarted_ = bVar3;
  (this->pos_).repeatGroupContinues_ = bVar4;
  return;
}

Assistant:

match_t() = default;